

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpec::Filter::serializeTo(Filter *this,ostream *out)

{
  bool bVar1;
  reference this_00;
  ostream *in_RSI;
  long in_RDI;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1_1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  bool first;
  Pattern *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
  local_48;
  long local_40;
  reference local_38;
  unique_ptr<Catch::TestSpec::Pattern> *local_30;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
  local_28 [2];
  byte local_11;
  ostream *local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  local_28[0]._M_current =
       (unique_ptr<Catch::TestSpec::Pattern> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
       ::begin((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                *)in_stack_ffffffffffffff88);
  local_30 = (unique_ptr<Catch::TestSpec::Pattern> *)
             std::
             vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
             ::end((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                    *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
               ::operator*(local_28);
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,' ');
    }
    Detail::unique_ptr<Catch::TestSpec::Pattern>::operator*(local_38);
    Catch::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_11 = 0;
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(local_28);
  }
  local_40 = in_RDI + 0x18;
  local_48._M_current =
       (unique_ptr<Catch::TestSpec::Pattern> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
       ::begin((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                *)in_stack_ffffffffffffff88);
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  ::end((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
         *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
              ::operator*(&local_48);
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,' ');
    }
    in_stack_ffffffffffffff90 = local_10;
    Detail::unique_ptr<Catch::TestSpec::Pattern>::operator*(this_00);
    Catch::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_11 = 0;
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void TestSpec::Filter::serializeTo( std::ostream& out ) const {
        bool first = true;
        for ( auto const& pattern : m_required ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
        for ( auto const& pattern : m_forbidden ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
    }